

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::findHoleBridge
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  double *pdVar1;
  Node *pNVar2;
  Node *ay;
  Earcut<unsigned_int> *bx;
  bool bVar3;
  Node *in_RDX;
  long in_RSI;
  Earcut<unsigned_int> *in_RDI;
  Earcut<unsigned_int> *pEVar4;
  double dVar5;
  Node *pNVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double my;
  double mx;
  double tanCur;
  double tanMin;
  Node *stop;
  double x;
  Node *m;
  double qx;
  double hy;
  double hx;
  Node *p;
  Node *local_b8;
  Node *b;
  Node *a;
  Earcut<unsigned_int> *this_00;
  Node *local_88;
  double local_60;
  Node *local_48;
  Node *local_40;
  Node *local_28;
  Node *local_8;
  
  pNVar2 = *(Node **)(in_RSI + 8);
  ay = *(Node **)(in_RSI + 0x10);
  dVar5 = std::numeric_limits<double>::infinity();
  local_40 = (Node *)((ulong)dVar5 ^ 0x8000000000000000);
  local_48 = (Node *)0x0;
  local_28 = in_RDX;
  do {
    if (((((double)ay <= local_28->y) && (local_28->next->y <= (double)ay)) &&
        ((dVar5 = local_28->next->y, dVar5 != local_28->y || (NAN(dVar5) || NAN(local_28->y))))) &&
       ((pNVar6 = (Node *)(local_28->x +
                          (((double)ay - local_28->y) * (local_28->next->x - local_28->x)) /
                          (local_28->next->y - local_28->y)), (double)pNVar6 <= (double)pNVar2 &&
        ((double)local_40 < (double)pNVar6)))) {
      if (((double)pNVar6 == (double)pNVar2) && (!NAN((double)pNVar6) && !NAN((double)pNVar2))) {
        if (((double)ay == local_28->y) && (!NAN((double)ay) && !NAN(local_28->y))) {
          return local_28;
        }
        pdVar1 = &local_28->next->y;
        if (((double)ay == *pdVar1) && (!NAN((double)ay) && !NAN(*pdVar1))) {
          return local_28->next;
        }
      }
      if (local_28->next->x <= local_28->x) {
        local_88 = local_28->next;
      }
      else {
        local_88 = local_28;
      }
      local_48 = local_88;
      local_40 = pNVar6;
    }
    pNVar6 = local_48;
    local_28 = local_28->next;
  } while (local_28 != in_RDX);
  if (local_48 == (Node *)0x0) {
    local_8 = (Node *)0x0;
  }
  else if (((double)pNVar2 != (double)local_40) || (NAN((double)pNVar2) || NAN((double)local_40))) {
    local_60 = std::numeric_limits<double>::infinity();
    local_28 = local_48;
    bx = (Earcut<unsigned_int> *)local_48->x;
    dVar5 = local_48->y;
    do {
      if (((local_28->x <= (double)pNVar2) && ((double)bx <= local_28->x)) &&
         (((double)pNVar2 != local_28->x || (NAN((double)pNVar2) || NAN(local_28->x))))) {
        local_b8 = pNVar2;
        b = local_40;
        if ((double)ay < dVar5) {
          local_b8 = local_40;
          b = pNVar2;
        }
        pEVar4 = in_RDI;
        a = ay;
        this_00 = bx;
        bVar3 = pointInTriangle(in_RDI,(double)b,(double)ay,(double)bx,dVar5,(double)local_b8,
                                (double)ay,local_28->x,local_28->y);
        if (bVar3) {
          std::abs((int)pEVar4);
          dVar7 = extraout_XMM0_Qa / ((double)pNVar2 - local_28->x);
          bVar3 = locallyInside(this_00,a,b);
          if (bVar3) {
            if (local_60 <= dVar7) {
              if (((dVar7 != local_60) || (NAN(dVar7) || NAN(local_60))) ||
                 ((local_28->x < local_48->x || local_28->x == local_48->x &&
                  (bVar3 = sectorContainsSector(this_00,a,b), !bVar3)))) goto LAB_0019cbea;
            }
            local_48 = local_28;
            local_60 = dVar7;
          }
        }
      }
LAB_0019cbea:
      local_28 = local_28->next;
    } while (local_28 != pNVar6);
    local_8 = local_48;
  }
  else {
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::findHoleBridge(Node* hole, Node* outerNode) {
    Node* p = outerNode;
    double hx = hole->x;
    double hy = hole->y;
    double qx = -std::numeric_limits<double>::infinity();
    Node* m = nullptr;

    // find a segment intersected by a ray from the hole's leftmost Vertex to the left;
    // segment's endpoint with lesser x will be potential connection Vertex
    do {
        if (hy <= p->y && hy >= p->next->y && p->next->y != p->y) {
          double x = p->x + (hy - p->y) * (p->next->x - p->x) / (p->next->y - p->y);
          if (x <= hx && x > qx) {
            qx = x;
            if (x == hx) {
                if (hy == p->y) return p;
                if (hy == p->next->y) return p->next;
            }
            m = p->x < p->next->x ? p : p->next;
          }
        }
        p = p->next;
    } while (p != outerNode);

    if (!m) return 0;

    if (hx == qx) return m; // hole touches outer segment; pick leftmost endpoint

    // look for points inside the triangle of hole Vertex, segment intersection and endpoint;
    // if there are no points found, we have a valid connection;
    // otherwise choose the Vertex of the minimum angle with the ray as connection Vertex

    const Node* stop = m;
    double tanMin = std::numeric_limits<double>::infinity();
    double tanCur = 0;

    p = m;
    double mx = m->x;
    double my = m->y;

    do {
        if (hx >= p->x && p->x >= mx && hx != p->x &&
            pointInTriangle(hy < my ? hx : qx, hy, mx, my, hy < my ? qx : hx, hy, p->x, p->y)) {

            tanCur = std::abs(hy - p->y) / (hx - p->x); // tangential

            if (locallyInside(p, hole) &&
                (tanCur < tanMin || (tanCur == tanMin && (p->x > m->x || sectorContainsSector(m, p))))) {
                m = p;
                tanMin = tanCur;
            }
        }

        p = p->next;
    } while (p != stop);

    return m;
}